

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O2

SQInteger __thiscall
SQTable::Next(SQTable *this,bool getweakrefs,SQObjectPtr *refpos,SQObjectPtr *outkey,
             SQObjectPtr *outval)

{
  SQUnsignedInteger SVar1;
  _HashNode *p_Var2;
  SQObjectPtr *obj;
  SQObject local_38;
  
  SVar1 = TranslateIndex(refpos);
  obj = &this->_nodes[SVar1].key;
  while( true ) {
    if (this->_numofnodes <= (long)SVar1) {
      return -1;
    }
    if ((obj->super_SQObject)._type != OT_NULL) break;
    SVar1 = SVar1 + 1;
    obj = (SQObjectPtr *)((long)(obj + 2) + 8);
  }
  SQObjectPtr::operator=(outkey,obj);
  p_Var2 = (_HashNode *)(obj + -1);
  if ((!getweakrefs) && ((p_Var2->val).super_SQObject._type == OT_WEAKREF)) {
    p_Var2 = (_HashNode *)
             &(((((_HashNode *)(obj + -1))->val).super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable._next;
  }
  local_38._type = (p_Var2->val).super_SQObject._type;
  local_38._4_4_ = *(undefined4 *)&(p_Var2->val).super_SQObject.field_0x4;
  local_38._unVal = (p_Var2->val).super_SQObject._unVal;
  SQObjectPtr::operator=(outval,&local_38);
  return SVar1 + 1;
}

Assistant:

SQInteger SQTable::Next(bool getweakrefs,const SQObjectPtr &refpos, SQObjectPtr &outkey, SQObjectPtr &outval)
{
    SQInteger idx = (SQInteger)TranslateIndex(refpos);
    while (idx < _numofnodes) {
        if(type(_nodes[idx].key) != OT_NULL) {
            //first found
            _HashNode &n = _nodes[idx];
            outkey = n.key;
            outval = getweakrefs?(SQObject)n.val:_realval(n.val);
            //return idx for the next iteration
            return ++idx;
        }
        ++idx;
    }
    //nothing to iterate anymore
    return -1;
}